

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

void update_playing_effects(IT_PLAYING *playing)

{
  uchar *puVar1;
  uchar uVar2;
  int iVar3;
  IT_CHANNEL *pIVar4;
  byte bVar5;
  byte bVar6;
  
  pIVar4 = playing->channel;
  if (pIVar4->channelvolslide != '\0') {
    playing->channel_volume = pIVar4->channelvolume;
  }
  if (pIVar4->okt_toneslide == '\0') {
    if (pIVar4->ptm_toneslide != '\0') {
      puVar1 = &pIVar4->toneslide_tick;
      *puVar1 = *puVar1 + 0xff;
      if (*puVar1 == '\0') {
        pIVar4->toneslide_tick = pIVar4->ptm_toneslide;
        bVar5 = playing->note + (char)pIVar4->toneslide;
        bVar6 = 0x77;
        if (pIVar4->toneslide < 0) {
          bVar6 = 0;
        }
        if (0x77 < bVar5) {
          bVar5 = bVar6;
        }
        playing->note = bVar5;
        if (pIVar4->playing == playing) {
          uVar2 = playing->note;
          pIVar4->truenote = uVar2;
          pIVar4->note = uVar2;
        }
        if (pIVar4->toneslide_retrig != '\0') {
          it_playing_reset_resamplers(playing,0);
          playing->declick_stage = '\0';
        }
      }
    }
  }
  else {
    pIVar4->okt_toneslide = pIVar4->okt_toneslide + 0xff;
    iVar3 = pIVar4->toneslide;
    bVar5 = playing->note + (char)iVar3;
    playing->note = bVar5;
    if (0x77 < bVar5) {
      if (iVar3 < 0) {
        playing->note = '\0';
      }
      else {
        playing->note = 'w';
      }
    }
  }
  return;
}

Assistant:

static void update_playing_effects(IT_PLAYING *playing)
{
	IT_CHANNEL *channel = playing->channel;

	if (channel->channelvolslide) {
		playing->channel_volume = channel->channelvolume;
	}

	if (channel->okt_toneslide) {
		if (channel->okt_toneslide--) {
			playing->note += channel->toneslide;
			if (playing->note >= 120) {
				if (channel->toneslide < 0) playing->note = 0;
				else playing->note = 119;
			}
		}
	} else if (channel->ptm_toneslide) {
		if (--channel->toneslide_tick == 0) {
			channel->toneslide_tick = channel->ptm_toneslide;
			if (playing) {
				playing->note += channel->toneslide;
				if (playing->note >= 120) {
					if (channel->toneslide < 0) playing->note = 0;
					else playing->note = 119;
				}
				if (channel->playing == playing) {
					channel->note = channel->truenote = playing->note;
				}
				if (channel->toneslide_retrig) {
					it_playing_reset_resamplers(playing, 0);
					playing->declick_stage = 0;
				}
			}
		}
	}
}